

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::FileDescriptorTables::FindFieldByNumber
          (FileDescriptorTables *this,Descriptor *parent,int number)

{
  ctrl_t *pcVar1;
  FieldsByNumberSet *this_00;
  size_t sVar2;
  slot_type pFVar3;
  ulong uVar4;
  Descriptor *pDVar5;
  uint uVar6;
  long lVar7;
  undefined1 *puVar8;
  ushort uVar9;
  uintptr_t v_3;
  ulong uVar10;
  ctrl_t *pcVar11;
  slot_type *ppFVar12;
  ulong uVar13;
  anon_union_8_1_a8a14541_for_iterator_2 aVar14;
  FieldDescriptor *pFVar15;
  reference ppFVar16;
  Nonnull<const_char_*> pcVar17;
  uint64_t v_6;
  undefined1 (*pauVar18) [16];
  undefined1 uVar19;
  uintptr_t v;
  undefined1 *unaff_RBP;
  uint uVar20;
  uintptr_t v_11;
  uint64_t v_14;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  iterator iVar26;
  const_iterator it;
  __m128i match;
  ulong local_a8;
  iterator local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  const_iterator local_40;
  
  aVar14._4_4_ = 0;
  aVar14._0_4_ = number;
  if ((0 < number && parent != (Descriptor *)0x0) &&
     (number <= (int)(uint)parent->sequential_field_limit_)) {
    if (parent->field_count_ < number) {
      pcVar17 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)(number + -1),(long)parent->field_count_,"index < field_count()");
    }
    else {
      pcVar17 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar17 == (Nonnull<const_char_*>)0x0) {
      return parent->fields_ + (number + -1);
    }
    FindFieldByNumber();
LAB_001e65ab:
    __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x78b,
                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                 );
  }
  this_00 = &this->fields_by_number_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  if (1 < (this->fields_by_number_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar13 = ((ulong)parent ^ 0x589848) * -0x234dd359734ecb13;
    uVar13 = ((uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
               (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
               (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28
              | uVar13 << 0x38) ^ (ulong)parent) * -0x234dd359734ecb13;
    unaff_RBP = (undefined1 *)
                ((ulong)aVar14.slot_ ^
                (uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                 (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                 (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                 (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38));
    uVar13 = (this_00->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    if (uVar13 == 1) {
      ppFVar12 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::soo_slot(&this_00->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
      pDVar5 = (*ppFVar12)->containing_type_;
      uVar20 = (*ppFVar12)->number_;
      if (uVar20 == number && pDVar5 == parent) {
        uVar13 = ((ulong)pDVar5 ^ 0x589848) * -0x234dd359734ecb13;
        uVar13 = ((uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
                   (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38) ^ (ulong)pDVar5) *
                 -0x234dd359734ecb13;
        if (unaff_RBP !=
            (ctrl_t *)
            ((uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
              (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8 |
              (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
             uVar13 << 0x38) ^ (ulong)uVar20)) {
LAB_001e63a2:
          __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfbf,
                        "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::AssertHashEqConsistent(const google::protobuf::(anonymous namespace)::ParentNumberQuery &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                       );
        }
      }
    }
    else {
      if (uVar13 == 0) goto LAB_001e6541;
      if (uVar13 < 0x11) {
        ppFVar12 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::slot_array(&this_00->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
        uVar13 = (this->fields_by_number_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        pauVar18 = (undefined1 (*) [16])
                   (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.heap_or_soo_.heap.control;
        if (uVar13 < 0xf) {
          if (8 < uVar13) goto LAB_001e65ab;
          uVar13 = *(ulong *)(*pauVar18 + uVar13) & 0x8080808080808080;
          if (uVar13 != 0x8080808080808080) {
            uVar13 = uVar13 ^ 0x8080808080808080;
            do {
              lVar7 = 0;
              if (uVar13 != 0) {
                for (; (uVar13 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
                }
              }
              lVar7 = *(long *)((long)ppFVar12 + ((ulong)((uint)lVar7 & 0xfffffff8) - 8));
              pDVar5 = *(Descriptor **)(lVar7 + 0x20);
              uVar20 = *(uint *)(lVar7 + 4);
              if (uVar20 == number && pDVar5 == parent) {
                uVar10 = ((ulong)pDVar5 ^ 0x589848) * -0x234dd359734ecb13;
                uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                           (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                           (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                           (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ (ulong)pDVar5) *
                         -0x234dd359734ecb13;
                if (unaff_RBP !=
                    (ctrl_t *)
                    ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                      (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                      (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                      (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ (ulong)uVar20))
                goto LAB_001e63a2;
              }
              uVar13 = uVar13 & uVar13 - 1;
            } while (uVar13 != 0);
          }
        }
        else {
          uVar13 = (this->fields_by_number_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          if (1 < uVar13) {
            uVar13 = uVar13 >> 1;
            while( true ) {
              auVar24 = *pauVar18;
              uVar20 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar24[0xf] >> 7) << 0xf);
              if (uVar20 != 0xffff) {
                uVar20 = ~uVar20;
                do {
                  uVar6 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  if ((char)(*pauVar18)[uVar6] < '\0') {
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  pDVar5 = ppFVar12[uVar6]->containing_type_;
                  uVar6 = ppFVar12[uVar6]->number_;
                  if (uVar6 == number && pDVar5 == parent) {
                    uVar10 = ((ulong)pDVar5 ^ 0x589848) * -0x234dd359734ecb13;
                    uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                               (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                               (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                               (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ (ulong)pDVar5) *
                             -0x234dd359734ecb13;
                    if (unaff_RBP !=
                        (ctrl_t *)
                        ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                          (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                          (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                          (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ (ulong)uVar6))
                    goto LAB_001e63a2;
                  }
                  uVar13 = uVar13 - 1;
                  uVar9 = (ushort)(uVar20 - 1) & (ushort)uVar20;
                  uVar20 = CONCAT22((short)(uVar20 - 1 >> 0x10),uVar9);
                } while (uVar9 != 0);
              }
              if (uVar13 == 0) break;
              ppFVar12 = ppFVar12 + 0x10;
              puVar8 = *pauVar18;
              pauVar18 = pauVar18 + 1;
              if (puVar8[0xf] == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FieldDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  sVar2 = (this_00->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (sVar2 != 1) {
    if (sVar2 != 0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::prefetch_heap_block
                (&this_00->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                );
      uVar13 = (this_00->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar13 == 1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                     );
      }
      if (uVar13 != 0) {
        if ((uVar13 + 1 & uVar13) != 0) {
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar10 = ((ulong)parent ^ 0x589848) * -0x234dd359734ecb13;
        uVar10 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                   (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) ^ (ulong)parent) *
                 -0x234dd359734ecb13;
        uVar10 = ((ulong)aVar14.slot_ ^
                 (uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                  (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                  (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                  (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38)) * -0x234dd359734ecb13;
        local_a8 = ((uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                     (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                     (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                     (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38) >> 7 ^
                   (ulong)(this->fields_by_number_).
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control >> 0xc) & uVar13;
        pcVar11 = absl::lts_20250127::container_internal::
                  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::control(&this_00->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           );
        uVar19 = (undefined1)(uVar10 >> 0x38);
        auVar24 = ZEXT216(CONCAT11(uVar19,uVar19) & 0x7f7f);
        auVar24 = pshuflw(auVar24,auVar24,0);
        local_68 = auVar24._0_4_;
        uVar10 = 0;
        uStack_64 = local_68;
        uStack_60 = local_68;
        uStack_5c = local_68;
        do {
          pcVar1 = pcVar11 + local_a8;
          local_58 = *pcVar1;
          cStack_57 = pcVar1[1];
          cStack_56 = pcVar1[2];
          cStack_55 = pcVar1[3];
          cStack_54 = pcVar1[4];
          cStack_53 = pcVar1[5];
          cStack_52 = pcVar1[6];
          cStack_51 = pcVar1[7];
          cStack_50 = pcVar1[8];
          cStack_4f = pcVar1[9];
          cStack_4e = pcVar1[10];
          cStack_4d = pcVar1[0xb];
          cStack_4c = pcVar1[0xc];
          cStack_4b = pcVar1[0xd];
          cStack_4a = pcVar1[0xe];
          cStack_49 = pcVar1[0xf];
          auVar24[0] = -((ctrl_t)local_68 == local_58);
          auVar24[1] = -(local_68._1_1_ == cStack_57);
          auVar24[2] = -(local_68._2_1_ == cStack_56);
          auVar24[3] = -(local_68._3_1_ == cStack_55);
          auVar24[4] = -((ctrl_t)uStack_64 == cStack_54);
          auVar24[5] = -(uStack_64._1_1_ == cStack_53);
          auVar24[6] = -(uStack_64._2_1_ == cStack_52);
          auVar24[7] = -(uStack_64._3_1_ == cStack_51);
          auVar24[8] = -((ctrl_t)uStack_60 == cStack_50);
          auVar24[9] = -(uStack_60._1_1_ == cStack_4f);
          auVar24[10] = -(uStack_60._2_1_ == cStack_4e);
          auVar24[0xb] = -(uStack_60._3_1_ == cStack_4d);
          auVar24[0xc] = -((ctrl_t)uStack_5c == cStack_4c);
          auVar24[0xd] = -(uStack_5c._1_1_ == cStack_4b);
          auVar24[0xe] = -(uStack_5c._2_1_ == cStack_4a);
          auVar24[0xf] = -(uStack_5c._3_1_ == cStack_49);
          uVar9 = (ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar24[0xf] >> 7) << 0xf;
          uVar20 = (uint)uVar9;
          while (uVar9 != 0) {
            uVar6 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            ppFVar12 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::slot_array(&this_00->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   );
            uVar21 = uVar6 + local_a8 & uVar13;
            pFVar3 = ppFVar12[uVar21];
            iVar26.field_1.slot_ = aVar14.slot_;
            iVar26.ctrl_ = (ctrl_t *)pFVar3;
            bVar22 = pFVar3->containing_type_ == parent;
            bVar23 = pFVar3->number_ == number;
            if (bVar23 && bVar22) {
              iVar26 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::iterator_at(&this_00->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ,uVar21);
              unaff_RBP = iVar26.ctrl_;
            }
            aVar14 = iVar26.field_1;
            if (bVar23 && bVar22) break;
            uVar9 = (ushort)(uVar20 - 1) & (ushort)uVar20;
            uVar20 = CONCAT22((short)(uVar20 - 1 >> 0x10),uVar9);
          }
          if (uVar9 != 0) {
LAB_001e61bb:
            bVar22 = false;
            uVar21 = uVar10;
          }
          else {
            auVar25[0] = -(local_58 == kEmpty);
            auVar25[1] = -(cStack_57 == kEmpty);
            auVar25[2] = -(cStack_56 == kEmpty);
            auVar25[3] = -(cStack_55 == kEmpty);
            auVar25[4] = -(cStack_54 == kEmpty);
            auVar25[5] = -(cStack_53 == kEmpty);
            auVar25[6] = -(cStack_52 == kEmpty);
            auVar25[7] = -(cStack_51 == kEmpty);
            auVar25[8] = -(cStack_50 == kEmpty);
            auVar25[9] = -(cStack_4f == kEmpty);
            auVar25[10] = -(cStack_4e == kEmpty);
            auVar25[0xb] = -(cStack_4d == kEmpty);
            auVar25[0xc] = -(cStack_4c == kEmpty);
            auVar25[0xd] = -(cStack_4b == kEmpty);
            auVar25[0xe] = -(cStack_4a == kEmpty);
            auVar25[0xf] = -(cStack_49 == kEmpty);
            if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar25 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar25 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar25 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar25 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar25 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar25 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                cStack_49 == kEmpty) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::AssertNotDebugCapacity
                        (&this_00->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        );
              unaff_RBP = (ctrl_t *)0x0;
              goto LAB_001e61bb;
            }
            uVar4 = (this_00->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ).settings_.
                    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                    .value.capacity_;
            if (uVar4 == 0) goto LAB_001e6541;
            uVar21 = uVar10 + 0x10;
            if (uVar4 < uVar21) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>, K = google::protobuf::(anonymous namespace)::ParentNumberQuery]"
                           );
            }
            local_a8 = local_a8 + uVar10 + 0x10 & uVar13;
            bVar22 = true;
          }
          uVar10 = uVar21;
        } while (bVar22);
        goto LAB_001e63f2;
      }
    }
LAB_001e6541:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, google::protobuf::(anonymous namespace)::ParentNumberHash, google::protobuf::(anonymous namespace)::ParentNumberEq, std::allocator<const google::protobuf::FieldDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FieldDescriptor *>, Hash = google::protobuf::(anonymous namespace)::ParentNumberHash, Eq = google::protobuf::(anonymous namespace)::ParentNumberEq, Alloc = std::allocator<const google::protobuf::FieldDescriptor *>]"
                 );
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  if (1 < (this->fields_by_number_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    ppFVar12 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::soo_slot(&this_00->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         );
    if (((*ppFVar12)->containing_type_ == parent) && ((*ppFVar12)->number_ == number)) {
      aVar14.slot_ = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::soo_slot(&this_00->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               );
      unaff_RBP = absl::lts_20250127::container_internal::kSooControl;
      goto LAB_001e63f2;
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  unaff_RBP = (ctrl_t *)0x0;
LAB_001e63f2:
  local_78.ctrl_ = unaff_RBP;
  local_78.field_1 = aVar14;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  local_40.inner_.ctrl_ = (ctrl_t *)0x0;
  bVar22 = absl::lts_20250127::container_internal::operator==((const_iterator *)&local_78,&local_40)
  ;
  if (bVar22) {
    pFVar15 = (FieldDescriptor *)0x0;
  }
  else {
    ppFVar16 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::(anonymous_namespace)::ParentNumberHash,_google::protobuf::(anonymous_namespace)::ParentNumberEq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ::iterator::operator*(&local_78);
    pFVar15 = *ppFVar16;
  }
  return pFVar15;
}

Assistant:

inline const FieldDescriptor* FileDescriptorTables::FindFieldByNumber(
    const Descriptor* parent, int number) const {
  // If `number` is within the sequential range, just index into the parent
  // without doing a table lookup.
  if (parent != nullptr &&  //
      1 <= number && number <= parent->sequential_field_limit_) {
    return parent->field(number - 1);
  }

  auto it = fields_by_number_.find(ParentNumberQuery{{parent, number}});
  return it == fields_by_number_.end() ? nullptr : *it;
}